

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O0

PVIPNode * PVIP_node_append_string(PVIPParserContext *parser,PVIPNode *node,char *txt,size_t length)

{
  PVIP_category_t PVar1;
  PVIPNode *n2;
  PVIPNode *s;
  size_t length_local;
  char *txt_local;
  PVIPNode *node_local;
  PVIPParserContext *parser_local;
  
  parser_local = (PVIPParserContext *)node;
  if (node->type == PVIP_NODE_STRING_CONCAT) {
    if ((node->field_2).children.nodes[(node->field_2).children.size + -1]->type == PVIP_NODE_STRING
       ) {
      PVIP_string_concat(((node->field_2).children.nodes[(node->field_2).children.size + -1]->
                         field_2).pv,txt,length);
    }
    else {
      n2 = PVIP_node_new_string(parser,PVIP_NODE_STRING,txt,length);
      parser_local = (PVIPParserContext *)
                     PVIP_node_new_children2(parser,PVIP_NODE_STRING_CONCAT,node,n2);
    }
  }
  else {
    PVar1 = PVIP_node_category(node->type);
    if (PVar1 != PVIP_CATEGORY_STRING) {
      __assert_fail("PVIP_node_category(node->type) == PVIP_CATEGORY_STRING",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                    ,0x83,
                    "PVIPNode *PVIP_node_append_string(PVIPParserContext *, PVIPNode *, const char *, size_t)"
                   );
    }
    PVIP_string_concat((node->field_2).pv,txt,length);
  }
  return (PVIPNode *)parser_local;
}

Assistant:

PVIPNode* PVIP_node_append_string(PVIPParserContext *parser, PVIPNode *node, const char* txt, size_t length) {
    if (node->type == PVIP_NODE_STRING_CONCAT) {
        if (node->children.nodes[node->children.size-1]->type == PVIP_NODE_STRING) {
            PVIP_string_concat(node->children.nodes[node->children.size-1]->pv, txt, length);
            return node;
        } else {
            PVIPNode *s = PVIP_node_new_string(parser, PVIP_NODE_STRING, txt, length);
            return PVIP_node_new_children2(parser, PVIP_NODE_STRING_CONCAT, node, s);
        }
    }

    assert(PVIP_node_category(node->type) == PVIP_CATEGORY_STRING);
    PVIP_string_concat(node->pv, txt, length);
    return node;
}